

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestOneof2::clear_foo(TestOneof2 *this)

{
  long *plVar1;
  Cord *this_00;
  FooCase FVar2;
  Arena *pAVar3;
  TestOneof2 *this_local;
  
  FVar2 = foo_case(this);
  switch(FVar2) {
  case FOO_NOT_SET:
    break;
  case kFooInt:
    break;
  case kFooString:
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.foo_.foo_string_);
    break;
  case kFooCord:
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.foo_.foo_string_);
    break;
  case kFooStringPiece:
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.foo_.foo_string_);
    break;
  case kFooBytes:
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.foo_.foo_string_);
    break;
  case kFooEnum:
    break;
  case kFooMessage:
    pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    if (pAVar3 == (Arena *)0x0) {
      plVar1 = *(long **)((long)&this->field_0 + 0x18);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    else {
      google::protobuf::internal::MaybePoisonAfterClear((this->field_0)._impl_.foo_.foo_message_);
    }
    break;
  case kFoogroup:
    pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    if (pAVar3 == (Arena *)0x0) {
      plVar1 = *(long **)((long)&this->field_0 + 0x18);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    else {
      google::protobuf::internal::MaybePoisonAfterClear((this->field_0)._impl_.foo_.foo_message_);
    }
    break;
  case kFooLazyMessage:
    pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    if (pAVar3 == (Arena *)0x0) {
      plVar1 = *(long **)((long)&this->field_0 + 0x18);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    else {
      google::protobuf::internal::MaybePoisonAfterClear((this->field_0)._impl_.foo_.foo_message_);
    }
    break;
  case kFooBytesCord:
    pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    if ((pAVar3 == (Arena *)0x0) &&
       (this_00 = *(Cord **)((long)&this->field_0 + 0x18), this_00 != (Cord *)0x0)) {
      absl::lts_20250127::Cord::~Cord(this_00);
      operator_delete(this_00,0x10);
    }
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestOneof2::clear_foo() {
// @@protoc_insertion_point(one_of_clear_start:proto2_unittest.TestOneof2)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (foo_case()) {
    case kFooInt: {
      // No need to clear
      break;
    }
    case kFooString: {
      _impl_.foo_.foo_string_.Destroy();
      break;
    }
    case kFooCord: {
      _impl_.foo_.foo_cord_.Destroy();
      break;
    }
    case kFooStringPiece: {
      _impl_.foo_.foo_string_piece_.Destroy();
      break;
    }
    case kFooBytes: {
      _impl_.foo_.foo_bytes_.Destroy();
      break;
    }
    case kFooEnum: {
      // No need to clear
      break;
    }
    case kFooMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.foo_.foo_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.foo_.foo_message_);
      }
      break;
    }
    case kFoogroup: {
      if (GetArena() == nullptr) {
        delete _impl_.foo_.foogroup_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.foo_.foogroup_);
      }
      break;
    }
    case kFooLazyMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.foo_.foo_lazy_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.foo_.foo_lazy_message_);
      }
      break;
    }
    case kFooBytesCord: {
      if (GetArena() == nullptr) {
        delete _impl_.foo_.foo_bytes_cord_;
      }
      break;
    }
    case FOO_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = FOO_NOT_SET;
}